

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O0

int32_t getSISOBytes(SISO_Option option,uint32_t cnvOption,uint8_t *value)

{
  int32_t local_1c;
  int32_t SISOLength;
  uint8_t *value_local;
  uint32_t cnvOption_local;
  SISO_Option option_local;
  
  local_1c = 0;
  if (option == SI) {
    if ((cnvOption & 0x1000) == 0) {
      if ((cnvOption & 0x2000) == 0) {
        if ((cnvOption & 0x4000) == 0) {
          *value = '\x0f';
          local_1c = 1;
        }
        else {
          *value = '\x1a';
          value[1] = 'q';
          local_1c = 2;
        }
      }
      else {
        *value = ')';
        local_1c = 1;
      }
    }
    else {
      *value = '\n';
      value[1] = 'A';
      local_1c = 2;
    }
  }
  else if (option == SO) {
    if ((cnvOption & 0x1000) == 0) {
      if ((cnvOption & 0x2000) == 0) {
        if ((cnvOption & 0x4000) == 0) {
          *value = '\x0e';
          local_1c = 1;
        }
        else {
          *value = '\x1a';
          value[1] = 'p';
          local_1c = 2;
        }
      }
      else {
        *value = '(';
        local_1c = 1;
      }
    }
    else {
      *value = '\n';
      value[1] = 'B';
      local_1c = 2;
    }
  }
  return local_1c;
}

Assistant:

static int32_t getSISOBytes(SISO_Option option, uint32_t cnvOption, uint8_t *value) {
    int32_t SISOLength = 0;

    switch (option) {
        case SI:
            if ((cnvOption&_MBCS_OPTION_KEIS)!=0) {
                value[0] = KEIS_SI_CHAR_1;
                value[1] = KEIS_SI_CHAR_2;
                SISOLength = 2;
            } else if ((cnvOption&_MBCS_OPTION_JEF)!=0) {
                value[0] = JEF_SI_CHAR;
                SISOLength = 1;
            } else if ((cnvOption&_MBCS_OPTION_JIPS)!=0) {
                value[0] = JIPS_SI_CHAR_1;
                value[1] = JIPS_SI_CHAR_2;
                SISOLength = 2;
            } else {
                value[0] = UCNV_SI;
                SISOLength = 1;
            }
            break;
        case SO:
            if ((cnvOption&_MBCS_OPTION_KEIS)!=0) {
                value[0] = KEIS_SO_CHAR_1;
                value[1] = KEIS_SO_CHAR_2;
                SISOLength = 2;
            } else if ((cnvOption&_MBCS_OPTION_JEF)!=0) {
                value[0] = JEF_SO_CHAR;
                SISOLength = 1;
            } else if ((cnvOption&_MBCS_OPTION_JIPS)!=0) {
                value[0] = JIPS_SO_CHAR_1;
                value[1] = JIPS_SO_CHAR_2;
                SISOLength = 2;
            } else {
                value[0] = UCNV_SO;
                SISOLength = 1;
            }
            break;
        default:
            /* Should never happen. */
            break;
    }

    return SISOLength;
}